

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O1

string * helics::stateString_abi_cxx11_(OperatingState state)

{
  int iVar1;
  string *psVar2;
  string *psVar3;
  
  if (stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::OperatingState)::
                                 connected_abi_cxx11_);
    if (iVar1 != 0) {
      stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_._M_dataplus._M_p =
           (pointer)&stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_,
                 "connected","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_);
    }
  }
  if (stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_);
    if (iVar1 != 0) {
      stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_._M_dataplus._M_p =
           (pointer)&stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_,
                 "error","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_);
    }
  }
  if (stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_);
    if (iVar1 != 0) {
      stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_._M_dataplus._M_p =
           (pointer)&stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_,
                 "disconnected","");
      __cxa_atexit(std::__cxx11::string::~string,
                   &stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_);
    }
  }
  psVar3 = &stateString[abi:cxx11](helics::OperatingState)::estate_abi_cxx11_;
  if (state == DISCONNECTED) {
    psVar3 = &stateString[abi:cxx11](helics::OperatingState)::dis_abi_cxx11_;
  }
  psVar2 = &stateString[abi:cxx11](helics::OperatingState)::connected_abi_cxx11_;
  if (state != OPERATING) {
    psVar2 = psVar3;
  }
  return psVar2;
}

Assistant:

const std::string& stateString(OperatingState state)
{
    static const std::string connected{"connected"};
    static const std::string estate{"error"};
    static const std::string dis{"disconnected"};
    switch (state) {
        case OperatingState::OPERATING:
            return connected;
        case OperatingState::DISCONNECTED:
            return dis;
        case OperatingState::ERROR_STATE:
        default:
            return estate;
    }
}